

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt__tesselate_curve
              (stbtt__point *points,int *num_points,float x0,float y0,float x1,float y1,float x2,
              float y2,float objspace_flatness_squared,int n)

{
  int in_EAX;
  int iVar1;
  float fVar2;
  float x2_00;
  float fVar3;
  float y2_00;
  
  if (n < 0x11) {
    fVar2 = x1 + x1 + x0;
    fVar3 = y1 + y1 + y0;
    iVar1 = n + 1;
    do {
      x2_00 = (fVar2 + x2) * 0.25;
      y2_00 = (fVar3 + y2) * 0.25;
      fVar2 = (y0 + y2) * 0.5 - y2_00;
      fVar3 = (x0 + x2) * 0.5 - x2_00;
      if (fVar3 * fVar3 + fVar2 * fVar2 <= objspace_flatness_squared) {
        iVar1 = *num_points;
        if (points != (stbtt__point *)0x0) {
          points[iVar1].x = x2;
          points[iVar1].y = y2;
        }
        *num_points = iVar1 + 1;
        return iVar1 + 1;
      }
      in_EAX = stbtt__tesselate_curve
                         (points,num_points,x0,y0,(x0 + x1) * 0.5,(y1 + y0) * 0.5,x2_00,y2_00,
                          objspace_flatness_squared,iVar1);
      x1 = (x1 + x2) * 0.5;
      y1 = (y1 + y2) * 0.5;
      fVar2 = x1 + x1 + x2_00;
      fVar3 = y1 + y1 + y2_00;
      iVar1 = iVar1 + 1;
      x0 = x2_00;
      y0 = y2_00;
    } while (iVar1 != 0x12);
  }
  return in_EAX;
}

Assistant:

static int stbtt__tesselate_curve(stbtt__point *points, int *num_points, float x0, float y0, float x1, float y1, float x2, float y2, float objspace_flatness_squared, int n)
{
   // midpoint
   float mx = (x0 + 2*x1 + x2)/4;
   float my = (y0 + 2*y1 + y2)/4;
   // versus directly drawn line
   float dx = (x0+x2)/2 - mx;
   float dy = (y0+y2)/2 - my;
   if (n > 16) // 65536 segments on one curve better be enough!
      return 1;
   if (dx*dx+dy*dy > objspace_flatness_squared) { // half-pixel error allowed... need to be smaller if AA
      stbtt__tesselate_curve(points, num_points, x0,y0, (x0+x1)/2.0f,(y0+y1)/2.0f, mx,my, objspace_flatness_squared,n+1);
      stbtt__tesselate_curve(points, num_points, mx,my, (x1+x2)/2.0f,(y1+y2)/2.0f, x2,y2, objspace_flatness_squared,n+1);
   } else {
      stbtt__add_point(points, *num_points,x2,y2);
      *num_points = *num_points+1;
   }
   return 1;
}